

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl.h
# Opt level: O2

void __thiscall
flatbuffers::SymbolTable<flatbuffers::ServiceDef>::~SymbolTable
          (SymbolTable<flatbuffers::ServiceDef> *this)

{
  ServiceDef *this_00;
  pointer ppSVar1;
  
  for (ppSVar1 = (this->vec).
                 super__Vector_base<flatbuffers::ServiceDef_*,_std::allocator<flatbuffers::ServiceDef_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppSVar1 !=
      (this->vec).
      super__Vector_base<flatbuffers::ServiceDef_*,_std::allocator<flatbuffers::ServiceDef_*>_>.
      _M_impl.super__Vector_impl_data._M_finish; ppSVar1 = ppSVar1 + 1) {
    this_00 = *ppSVar1;
    if (this_00 != (ServiceDef *)0x0) {
      ServiceDef::~ServiceDef(this_00);
    }
    operator_delete(this_00,0x110);
  }
  std::_Vector_base<flatbuffers::ServiceDef_*,_std::allocator<flatbuffers::ServiceDef_*>_>::
  ~_Vector_base(&(this->vec).
                 super__Vector_base<flatbuffers::ServiceDef_*,_std::allocator<flatbuffers::ServiceDef_*>_>
               );
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::ServiceDef_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::ServiceDef_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::ServiceDef_*>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::ServiceDef_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::ServiceDef_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::ServiceDef_*>_>_>
               *)this);
  return;
}

Assistant:

~SymbolTable() {
    for (auto it = vec.begin(); it != vec.end(); ++it) { delete *it; }
  }